

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatStl.h
# Opt level: O1

size_t Corrade::Utility::formatInto<unsigned_int,unsigned_int>
                 (string *buffer,size_t offset,char *format,uint *args,uint *args_1)

{
  size_t sVar1;
  BufferFormatter formatters [3];
  MutableStringView local_78;
  BufferFormatter local_68;
  undefined8 local_50;
  code *local_48;
  uint *local_40;
  undefined8 local_38;
  undefined8 local_30;
  undefined8 uStack_28;
  
  local_68.size = 0xffffffffffffffff;
  local_68._fn = Implementation::BufferFormatter::BufferFormatter<unsigned_int>(unsigned_int_const&)
                 ::
                 {lambda(Corrade::Containers::BasicStringView<char>const&,void_const*,int,Corrade::Utility::Implementation::FormatType)#1}
                 ::FormatType_;
  local_50 = 0xffffffffffffffff;
  local_48 = Implementation::BufferFormatter::BufferFormatter<unsigned_int>(unsigned_int_const&)::
             {lambda(Corrade::Containers::BasicStringView<char>const&,void_const*,int,Corrade::Utility::Implementation::FormatType)#1}
             ::FormatType_;
  local_38 = 0xffffffffffffffff;
  local_30 = 0;
  uStack_28 = 0;
  local_78._data = (char *)0x0;
  local_78._sizePlusFlags = 0x8000000000000000;
  local_68._value = args;
  local_40 = args_1;
  sVar1 = Implementation::formatFormatters(&local_78,format,&local_68,2);
  if (buffer->_M_string_length < sVar1 + offset) {
    std::__cxx11::string::resize((ulong)buffer,(char)(sVar1 + offset));
  }
  local_78._data = (buffer->_M_dataplus)._M_p + offset;
  local_78._sizePlusFlags = buffer->_M_string_length + 1;
  sVar1 = Implementation::formatFormatters(&local_78,format,&local_68,2);
  return sVar1 + offset;
}

Assistant:

std::size_t formatInto(std::string& buffer, std::size_t offset, const char* format, const Args&... args) {
    Implementation::BufferFormatter formatters[sizeof...(args) + 1] { Implementation::BufferFormatter{args}..., {} };
    return Implementation::formatFormatters(buffer, offset, format, formatters, sizeof...(args));
}